

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O0

SN_ELEMENT * __thiscall
ON_SerialNumberMap::RemoveId(ON_SerialNumberMap *this,ON__UINT64 sn,ON_UUID id)

{
  ON_UUID id_00;
  bool bVar1;
  ON__UINT32 OVar2;
  SN_ELEMENT *pSVar3;
  SN_ELEMENT **ppSVar4;
  SN_ELEMENT *local_68;
  SN_ELEMENT *prev;
  ON__UINT32 hash_i;
  SN_ELEMENT **hash_table_block;
  ON__UINT32 id_crc32;
  SN_ELEMENT *local_38;
  SN_ELEMENT *e;
  ON__UINT64 sn_local;
  ON_SerialNumberMap *this_local;
  ON_UUID id_local;
  
  id_local._0_8_ = id.Data4;
  this_local = id._0_8_;
  if (((this->m_active_id_count != 0) && (bVar1 = IdIsNotNil((ON_UUID *)&this_local), bVar1)) &&
     (bVar1 = IdIsNotEqual((ON_UUID *)&this_local,&this->m_inactive_id), bVar1)) {
    if (this->m_bHashTableIsValid == '\0') {
      if (sn == 0) {
        id_00.Data4 = (uchar  [8])id_local._0_8_;
        id_00._0_8_ = this_local;
        pSVar3 = Internal_HashTableFindId(this,id_00,0,false);
        if (pSVar3 != (SN_ELEMENT *)0x0) {
          pSVar3 = Internal_HashTableRemoveElement(this,pSVar3,true);
          return pSVar3;
        }
      }
      else {
        pSVar3 = FindSerialNumber(this,sn);
        if (pSVar3 != (SN_ELEMENT *)0x0) {
          pSVar3 = Internal_HashTableRemoveElement(this,pSVar3,true);
          return pSVar3;
        }
      }
      Internal_HashTableBuild(this);
    }
    OVar2 = IdCRC32((ON_UUID *)&this_local);
    ppSVar4 = Internal_HashTableBlock(this,OVar2);
    OVar2 = Internal_HashTableBlockRowIndex(OVar2);
    local_68 = (SN_ELEMENT *)0x0;
    for (local_38 = ppSVar4[OVar2]; local_38 != (SN_ELEMENT *)0x0; local_38 = local_38->m_next) {
      bVar1 = IdIsEqual(&local_38->m_id,(ON_UUID *)&this_local);
      if (bVar1) {
        if (local_68 == (SN_ELEMENT *)0x0) {
          ppSVar4[OVar2] = local_38->m_next;
        }
        else {
          local_68->m_next = local_38->m_next;
        }
        pSVar3 = Internal_HashTableRemoveElement(this,local_38,false);
        return pSVar3;
      }
      local_68 = local_38;
    }
  }
  return (SN_ELEMENT *)0x0;
}

Assistant:

struct ON_SerialNumberMap::SN_ELEMENT* 
ON_SerialNumberMap::RemoveId(ON__UINT64 sn, ON_UUID id)
{
  if ( m_active_id_count > 0 && IdIsNotNil(&id) && IdIsNotEqual(&id,&m_inactive_id))
  {
    struct SN_ELEMENT* e;
    if ( false == m_bHashTableIsValid )
    {
      if (sn > 0)
      {
        // We can avoid rebuilding the hash table.
        // Use the serial number to find the element.
        e = FindSerialNumber(sn);
        if (nullptr != e)
          return Internal_HashTableRemoveElement(e,true);
      }
      else
      {
        // check most recently added elements
        e = Internal_HashTableFindId(id, 0, false);
        if (nullptr != e)
        {
          // got lucky
          return Internal_HashTableRemoveElement(e,true);
        }
      }
      
      // have to build hash table (expensive)
      Internal_HashTableBuild();
    }

    const ON__UINT32 id_crc32 = IdCRC32(&id);
    struct SN_ELEMENT** hash_table_block = Internal_HashTableBlock(id_crc32);
    const ON__UINT32 hash_i = ON_SerialNumberMap::Internal_HashTableBlockRowIndex(id_crc32);
    struct SN_ELEMENT* prev = nullptr;
    for (e = hash_table_block[hash_i]; nullptr != e; e = e->m_next)
    {
      if ( IdIsEqual(&e->m_id,&id) )
      {
        if (nullptr != prev)
          prev->m_next = e->m_next;
        else
          hash_table_block[hash_i] = e->m_next;
        return Internal_HashTableRemoveElement(e,false);
      }
      prev = e;
    }
  }

  return nullptr;
}